

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O3

QSize __thiscall QDockWidgetLayout::maximumSize(QDockWidgetLayout *this)

{
  QLayoutItem *pQVar1;
  Representation extraout_var;
  QWidget *pQVar2;
  QSize QVar3;
  long in_FS_OFFSET;
  QSize local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(this->item_list).d.ptr;
  if (pQVar1 == (QLayoutItem *)0x0) {
    pQVar2 = QLayout::parentWidget(&this->super_QLayout);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QVar3 = QWidget::maximumSize(pQVar2);
      return QVar3;
    }
  }
  else {
    local_20.wd.m_i = (*pQVar1->_vptr_QLayoutItem[4])();
    local_20.ht.m_i = extraout_var.m_i;
    pQVar2 = QLayout::parentWidget(&this->super_QLayout);
    QVar3 = sizeFromContent(this,&local_20,
                            (bool)((byte)(pQVar2->data->window_flags).
                                         super_QFlagsStorageHelper<Qt::WindowType,_4>.
                                         super_QFlagsStorage<Qt::WindowType>.i & 1));
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return QVar3;
    }
  }
  __stack_chk_fail();
}

Assistant:

QSize QDockWidgetLayout::maximumSize() const
{
    if (item_list[Content] != 0) {
        const QSize content = item_list[Content]->maximumSize();
        return sizeFromContent(content, parentWidget()->isWindow());
    } else {
        return parentWidget()->maximumSize();
    }

}